

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O0

void __thiscall Assimp::ColladaExporter::WritePointLight(ColladaExporter *this,aiLight *light)

{
  ostream *poVar1;
  aiColor3D *color;
  aiLight *light_local;
  ColladaExporter *this_local;
  
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<point>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PushTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<color sid=\"color\">");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(light->mColorDiffuse).r);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(light->mColorDiffuse).g);
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(light->mColorDiffuse).b);
  poVar1 = std::operator<<(poVar1,"</color>");
  std::operator<<(poVar1,(string *)&this->endstr);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<constant_attenuation>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->mAttenuationConstant);
  poVar1 = std::operator<<(poVar1,"</constant_attenuation>");
  std::operator<<(poVar1,(string *)&this->endstr);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<linear_attenuation>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->mAttenuationLinear);
  poVar1 = std::operator<<(poVar1,"</linear_attenuation>");
  std::operator<<(poVar1,(string *)&this->endstr);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"<quadratic_attenuation>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,light->mAttenuationQuadratic);
  poVar1 = std::operator<<(poVar1,"</quadratic_attenuation>");
  std::operator<<(poVar1,(string *)&this->endstr);
  PopTag(this);
  poVar1 = std::operator<<((ostream *)&this->field_0x38,(string *)&this->startstr);
  poVar1 = std::operator<<(poVar1,"</point>");
  std::operator<<(poVar1,(string *)&this->endstr);
  return;
}

Assistant:

void ColladaExporter::WritePointLight(const aiLight *const light){
    const aiColor3D &color=  light->mColorDiffuse;
    mOutput << startstr << "<point>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;
    mOutput << startstr << "<constant_attenuation>"
                            << light->mAttenuationConstant
                        <<"</constant_attenuation>" << endstr;
    mOutput << startstr << "<linear_attenuation>"
                            << light->mAttenuationLinear
                        <<"</linear_attenuation>" << endstr;
    mOutput << startstr << "<quadratic_attenuation>"
                            << light->mAttenuationQuadratic
                        <<"</quadratic_attenuation>" << endstr;

    PopTag();
    mOutput << startstr << "</point>" << endstr;

}